

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  ptls_esni_secret_t **esni;
  ptls_key_exchange_context_t **pppVar1;
  byte bVar2;
  ushort uVar3;
  ptls_key_schedule_t *ppVar4;
  ptls_context_t *ppVar5;
  ptls_cipher_suite_t *ppVar6;
  st_ptls_update_esni_key_t *psVar7;
  size_t *psVar8;
  ptls_buffer_t *buf;
  ptls_buffer_t *buf_00;
  ptls_key_exchange_algorithm_t *ppVar9;
  size_t sVar10;
  st_ptls_key_exchange_algorithm_t *psVar11;
  ptls_iovec_t *ppVar12;
  size_t sVar13;
  ptls_hash_algorithm_t *ppVar14;
  ptls_iovec_t pVar15;
  ptls_message_emitter_t *ppVar16;
  undefined8 uVar17;
  ushort uVar18;
  int iVar19;
  int iVar20;
  ptls_early_data_acceptance_t pVar21;
  int iVar22;
  ptls_esni_secret_t *ppVar23;
  ushort *end;
  ptls_cipher_suite_t **pppVar24;
  ptls_hash_context_t *ppVar25;
  uint8_t *src;
  ptls_key_schedule_t *sched;
  uint64_t uVar26;
  size_t sVar27;
  ptls_key_exchange_algorithm_t **pppVar28;
  long lVar29;
  long lVar30;
  ushort *puVar31;
  size_t sVar32;
  long lVar33;
  ulong uVar34;
  ushort *puVar35;
  ushort *puVar36;
  size_t len;
  ulong uVar37;
  size_t delta;
  uint8_t *puVar38;
  bool bVar39;
  ptls_iovec_t ikm;
  char *local_158;
  long local_150;
  ushort *local_148;
  size_t local_140;
  ushort *local_128;
  ptls_message_emitter_t *local_120;
  undefined1 local_115;
  undefined1 local_114;
  undefined1 local_113;
  ushort local_112;
  ushort local_110;
  ushort local_10e;
  undefined1 local_10c;
  ushort local_10b;
  undefined1 local_109;
  ushort *local_108;
  ptls_key_exchange_algorithm_t **local_100;
  anon_struct_104_5_dae46d3e_for_client *local_f8;
  size_t local_f0;
  ptls_buffer_t *local_e8;
  ptls_iovec_t *local_e0;
  size_t local_d8;
  uint64_t not_before;
  uint32_t max_early_data_size;
  uint32_t age_add;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined2 local_b6;
  undefined2 local_b4;
  undefined2 local_b2;
  undefined2 local_b0;
  undefined2 local_ae;
  undefined2 local_ac;
  undefined2 local_aa;
  undefined2 local_a8;
  undefined2 local_a6;
  undefined2 local_a4;
  undefined2 local_a2;
  undefined2 local_a0;
  undefined2 local_9e;
  undefined2 local_9c;
  undefined2 local_9a;
  ptls_iovec_t resumption_ticket;
  uint64_t not_after;
  char *local_80;
  uint8_t binder_key [64];
  
  ppVar4 = tls->key_schedule;
  local_e0 = cookie;
  if (tls->server_name == (char *)0x0) {
    bVar39 = false;
  }
  else {
    iVar19 = ptls_server_name_is_ipaddr(tls->server_name);
    bVar39 = iVar19 == 0;
  }
  local_120 = emitter;
  if (properties != (ptls_handshake_properties_t *)0x0) {
    iVar19 = 0;
    if ((bool)(ppVar4 == (ptls_key_schedule_t *)0x0 & bVar39)) {
      puVar35 = (ushort *)(properties->field_0).client.esni_keys.base;
      if (puVar35 != (ushort *)0x0) {
        ppVar5 = tls->ctx;
        uVar34 = (properties->field_0).client.esni_keys.len;
        ppVar23 = (ptls_esni_secret_t *)calloc(1,0xd0);
        tls->esni = ppVar23;
        if (ppVar23 == (ptls_esni_secret_t *)0x0) {
          iVar20 = 0x201;
          local_158 = (char *)0x0;
          goto LAB_00108641;
        }
        esni = &tls->esni;
        if (((1 < (long)uVar34) && ((ushort)(*puVar35 << 8 | *puVar35 >> 8) == 0xff02)) &&
           (5 < uVar34)) {
          local_100 = (ptls_key_exchange_algorithm_t **)tls->client_random;
          local_f8 = &ppVar23->client;
          local_e8 = (ptls_buffer_t *)&(ppVar23->client).cipher;
          end = (ushort *)(uVar34 + (long)puVar35);
          for (pppVar24 = ppVar5->cipher_suites; ppVar6 = *pppVar24,
              ppVar6 != (ptls_cipher_suite_t *)0x0; pppVar24 = pppVar24 + 1) {
            if ((ppVar6->id | 2) == 0x1303) {
              ppVar25 = (*ppVar6->hash->create)();
              if (ppVar25 != (ptls_hash_context_t *)0x0) {
                (*ppVar25->update)(ppVar25,puVar35,2);
                (*ppVar25->update)(ppVar25,"",4);
                local_108 = (ushort *)(uVar34 - 6);
                (*ppVar25->update)(ppVar25,puVar35 + 3);
                (*ppVar25->final)(ppVar25,binder_key,PTLS_HASH_FINAL_MODE_FREE);
                if (((*(int *)(puVar35 + 1) == binder_key._0_4_) &&
                    (ppVar23->version = 0xff02, (ushort *)0x1 < local_108)) &&
                   (uVar37 = (ulong)(ushort)(puVar35[3] << 8 | puVar35[3] >> 8),
                   uVar37 <= uVar34 - 8)) {
                  local_158 = (char *)malloc(uVar37 + 1);
                  if (local_158 == (char *)0x0) {
                    local_158 = (char *)0x0;
                    goto LAB_001083d2;
                  }
                  puVar36 = (ushort *)((long)(puVar35 + 4) + uVar37);
                  if (uVar37 != 0) {
                    local_108 = puVar36;
                    memcpy(local_158,puVar35 + 4,uVar37);
                    puVar36 = local_108;
                  }
                  local_158[uVar37] = '\0';
                  if ((ulong)((long)end - (long)puVar36) < 2) goto LAB_001083d2;
                  uVar37 = (ulong)(ushort)(*puVar36 << 8 | *puVar36 >> 8);
                  local_128 = puVar36 + 1;
                  if ((ulong)((long)end - (long)local_128) < uVar37) goto LAB_001083d2;
                  puVar36 = (ushort *)((long)local_128 + uVar37);
                  iVar20 = select_key_share(&local_f8->key_share,&resumption_ticket,
                                            ppVar5->key_exchanges,(uint8_t **)&local_128,
                                            (uint8_t *)puVar36,0);
                  if (((iVar20 != 0) || (local_128 != puVar36)) ||
                     ((ulong)((long)end - (long)puVar36) < 2)) goto LAB_001083d2;
                  uVar37 = (ulong)(ushort)(*local_128 << 8 | *local_128 >> 8);
                  puVar36 = local_128 + 1;
                  if ((ulong)((long)end - (long)puVar36) < uVar37) goto LAB_001083d2;
                  puVar31 = (ushort *)(uVar37 + (long)puVar36);
                  iVar20 = select_cipher((ptls_cipher_suite_t **)local_e8,ppVar5->cipher_suites,
                                         (uint8_t *)puVar36,(uint8_t *)puVar31,
                                         *(uint *)&ppVar5->field_0x70 >> 6 & 1);
                  if ((iVar20 != 0) || ((long)end - (long)puVar31 < 2)) goto LAB_001083d2;
                  (ppVar23->client).padded_length = *puVar31 << 8 | *puVar31 >> 8;
                  local_128 = puVar31 + 1;
                  iVar20 = ptls_decode64(&not_before,(uint8_t **)&local_128,(uint8_t *)end);
                  if ((iVar20 != 0) ||
                     ((iVar20 = ptls_decode64(&not_after,(uint8_t **)&local_128,(uint8_t *)end),
                      iVar20 != 0 || ((ulong)((long)end - (long)local_128) < 2))))
                  goto LAB_001083d2;
                  uVar37 = (ulong)(ushort)(*local_128 << 8 | *local_128 >> 8);
                  puVar36 = local_128 + 1;
                  if ((ulong)((long)end - (long)puVar36) < uVar37) goto LAB_001083d2;
                  puVar31 = (ushort *)(uVar37 + (long)puVar36);
                  goto LAB_00108e89;
                }
              }
              break;
            }
          }
        }
        local_158 = (char *)0x0;
        goto LAB_001083d2;
      }
      local_158 = (char *)0x0;
    }
    else {
      local_158 = (char *)0x0;
    }
    goto LAB_0010841d;
  }
  local_148 = (ushort *)0x0;
  uVar34 = 0;
  local_158 = (char *)0x0;
  iVar19 = 0;
  iVar22 = 0;
  if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) goto LAB_00108518;
LAB_0010852c:
  if (ppVar4 == (ptls_key_schedule_t *)0x0) {
    sched = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                             tls->ctx->hkdf_label_prefix__obsolete);
    tls->key_schedule = sched;
    ikm.len = uVar34;
    ikm.base = (uint8_t *)local_148;
    iVar20 = key_schedule_extract(sched,ikm);
    if (iVar20 != 0) goto LAB_00108641;
  }
  ppVar16 = local_120;
  lVar33 = local_120->record_header_length + local_120->buf->off;
  iVar20 = (*local_120->begin_message)(local_120);
  if (iVar20 == 0) {
    buf = ppVar16->buf;
    local_109 = 1;
    iVar20 = ptls_buffer__do_pushv(buf,&local_109,1);
    if ((iVar20 == 0) && (iVar20 = ptls_buffer__do_pushv(buf,"",3), iVar20 == 0)) {
      local_f8 = (anon_struct_104_5_dae46d3e_for_client *)buf->off;
      buf_00 = local_120->buf;
      local_9a = 0x303;
      iVar20 = ptls_buffer__do_pushv(buf_00,&local_9a,2);
      if ((iVar20 == 0) &&
         ((local_e8 = buf, iVar20 = ptls_buffer__do_pushv(buf_00,tls->client_random,0x20),
          iVar20 == 0 && (iVar20 = ptls_buffer__do_pushv(buf_00,"",1), iVar20 == 0)))) {
        sVar10 = buf_00->off;
        iVar20 = ptls_buffer__do_pushv
                           (buf_00,(tls->field_18).client.legacy_session_id.base,
                            (tls->field_18).client.legacy_session_id.len);
        if (iVar20 == 0) {
          buf_00->base[sVar10 - 1] = (char)(int)buf_00->off - (char)sVar10;
          iVar20 = ptls_buffer__do_pushv(buf_00,"",2);
          if (iVar20 == 0) {
            local_100 = (ptls_key_exchange_algorithm_t **)0x10;
            sVar10 = buf_00->off;
            pppVar24 = tls->ctx->cipher_suites;
            do {
              if (*pppVar24 == (ptls_cipher_suite_t *)0x0) {
                lVar29 = buf_00->off - sVar10;
                buf_00->base[sVar10 - 2] = (uint8_t)((ulong)lVar29 >> 8);
                buf_00->base[sVar10 - 1] = (uint8_t)lVar29;
                iVar20 = ptls_buffer__do_pushv(buf_00,"",1);
                if (iVar20 != 0) break;
                sVar10 = buf_00->off;
                local_10c = 0;
                iVar20 = ptls_buffer__do_pushv(buf_00,&local_10c,1);
                if (iVar20 != 0) break;
                buf_00->base[sVar10 - 1] = (char)(int)buf_00->off - (char)sVar10;
                iVar20 = ptls_buffer__do_pushv(buf_00,"",2);
                if (iVar20 != 0) break;
                local_108 = (ushort *)buf_00->off;
                local_9c = 0x3300;
                iVar20 = ptls_buffer__do_pushv(buf_00,&local_9c,2);
                if ((iVar20 != 0) || (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 != 0))
                break;
                local_f0 = buf_00->off;
                iVar20 = ptls_buffer__do_pushv(buf_00,"",2);
                if (iVar20 != 0) break;
                sVar10 = buf_00->off;
                psVar11 = tls->key_share;
                sVar27 = sVar10;
                if (psVar11 != (st_ptls_key_exchange_algorithm_t *)0x0) {
                  pppVar1 = &(tls->field_18).client.key_share_ctx;
                  iVar20 = (*psVar11->create)(psVar11,pppVar1);
                  if ((iVar20 != 0) ||
                     (iVar20 = push_key_share_entry(buf_00,tls->key_share->id,(*pppVar1)->pubkey),
                     iVar20 != 0)) break;
                  sVar27 = buf_00->off;
                }
                buf_00->base[sVar10 - 2] = (uint8_t)(sVar27 - sVar10 >> 8);
                buf_00->base[sVar10 - 1] = (uint8_t)(sVar27 - sVar10);
                lVar29 = buf_00->off - local_f0;
                buf_00->base[local_f0 - 2] = (uint8_t)((ulong)lVar29 >> 8);
                buf_00->base[local_f0 - 1] = (uint8_t)lVar29;
                if (bVar39) {
                  if (tls->esni == (ptls_esni_secret_t *)0x0) {
                    local_a2 = 0;
                    iVar20 = ptls_buffer__do_pushv(buf_00,&local_a2,2);
                    if ((iVar20 != 0) || (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 != 0))
                    break;
                    sVar10 = buf_00->off;
                    iVar20 = emit_server_name_extension(buf_00,tls->server_name);
                  }
                  else {
                    if (local_158 != (char *)0x0) {
                      local_9e = 0;
                      iVar20 = ptls_buffer__do_pushv(buf_00,&local_9e,2);
                      if ((iVar20 != 0) ||
                         (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 != 0)) break;
                      sVar10 = buf_00->off;
                      iVar20 = emit_server_name_extension(buf_00,local_158);
                      if (iVar20 != 0) break;
                      lVar30 = buf_00->off - sVar10;
                      buf_00->base[sVar10 - 2] = (uint8_t)((ulong)lVar30 >> 8);
                      buf_00->base[sVar10 - 1] = (uint8_t)lVar30;
                    }
                    local_a0 = 0xceff;
                    iVar20 = ptls_buffer__do_pushv(buf_00,&local_a0,2);
                    if ((iVar20 != 0) || (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 != 0))
                    break;
                    sVar10 = buf_00->off;
                    local_80 = tls->server_name;
                    ppVar23 = tls->esni;
                    binder_key[0] = '\0';
                    binder_key[1] = '\0';
                    binder_key[2] = '\0';
                    binder_key[3] = '\0';
                    binder_key[4] = '\0';
                    binder_key[5] = '\0';
                    binder_key[6] = '\0';
                    binder_key[7] = '\0';
                    iVar20 = create_esni_aead((ptls_aead_context_t **)binder_key,1,
                                              (ppVar23->client).cipher,ppVar23->secret,
                                              ppVar23->esni_contents_hash);
                    if (iVar20 == 0) {
                      uVar18 = ((ppVar23->client).cipher)->id;
                      local_128 = (ushort *)CONCAT62(local_128._2_6_,uVar18 << 8 | uVar18 >> 8);
                      iVar20 = ptls_buffer__do_pushv(buf_00,&local_128,2);
                      if (((iVar20 == 0) &&
                          (iVar20 = push_key_share_entry
                                              (buf_00,((ppVar23->client).key_share)->id,
                                               (ppVar23->client).pubkey), iVar20 == 0)) &&
                         (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 == 0)) {
                        sVar27 = buf_00->off;
                        iVar20 = ptls_buffer__do_pushv
                                           (buf_00,(ppVar23->client).record_digest,
                                            ((ppVar23->client).cipher)->hash->digest_size);
                        if (iVar20 == 0) {
                          lVar30 = buf_00->off - sVar27;
                          buf_00->base[sVar27 - 2] = (uint8_t)((ulong)lVar30 >> 8);
                          buf_00->base[sVar27 - 1] = (uint8_t)lVar30;
                          iVar20 = ptls_buffer__do_pushv(buf_00,"",2);
                          if (iVar20 == 0) {
                            local_d8 = buf_00->off;
                            iVar20 = ptls_buffer__do_pushv(buf_00,ppVar23->nonce,0x10);
                            if ((iVar20 == 0) &&
                               (iVar20 = emit_server_name_extension(buf_00,local_80), iVar20 == 0))
                            {
                              uVar34 = buf_00->off - local_d8;
                              uVar37 = (ulong)(ppVar23->client).padded_length + 0x10;
                              delta = uVar37 - uVar34;
                              if (uVar34 <= uVar37 && delta != 0) {
                                iVar20 = ptls_buffer_reserve(buf_00,delta);
                                if (iVar20 != 0) goto LAB_00108d58;
                                memset(buf_00->base + buf_00->off,0,delta);
                                buf_00->off = buf_00->off + delta;
                              }
                              uVar17 = binder_key._0_8_;
                              iVar20 = ptls_buffer_reserve(buf_00,*(size_t *)
                                                                   (*(long *)binder_key._0_8_ + 0x38
                                                                   ));
                              if (iVar20 == 0) {
                                puVar38 = buf_00->base + local_d8;
                                iVar20 = 0;
                                (**(code **)(uVar17 + 0x30))
                                          (uVar17,puVar38,puVar38,buf_00->off - local_d8,0,
                                           buf_00->base + local_f0,lVar29,0);
                                sVar27 = buf_00->off + *(long *)(*(long *)uVar17 + 0x38);
                                buf_00->off = sVar27;
                                lVar29 = sVar27 - local_d8;
                                buf_00->base[local_d8 - 2] = (uint8_t)((ulong)lVar29 >> 8);
                                buf_00->base[local_d8 - 1] = (uint8_t)lVar29;
                              }
                            }
                          }
                        }
                      }
                    }
LAB_00108d58:
                    if (binder_key._0_8_ != 0) {
                      ptls_aead_free((ptls_aead_context_t *)binder_key._0_8_);
                    }
                  }
                  if (iVar20 != 0) break;
                  lVar29 = buf_00->off - sVar10;
                  buf_00->base[sVar10 - 2] = (uint8_t)((ulong)lVar29 >> 8);
                  buf_00->base[sVar10 - 1] = (uint8_t)lVar29;
                }
                if ((properties == (ptls_handshake_properties_t *)0x0) ||
                   ((properties->field_0).client.negotiated_protocols.count == 0))
                goto LAB_0010916e;
                local_a4 = 0x1000;
                iVar20 = ptls_buffer__do_pushv(buf_00,&local_a4,2);
                if ((iVar20 == 0) && (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 == 0)) {
                  local_f0 = buf_00->off;
                  iVar20 = ptls_buffer__do_pushv(buf_00,"",2);
                  if (iVar20 == 0) {
                    sVar10 = buf_00->off;
                    lVar29 = 8;
                    local_140 = 0;
                    goto LAB_001090cd;
                  }
                }
                break;
              }
              uVar18 = (*pppVar24)->id;
              local_10b = uVar18 << 8 | uVar18 >> 8;
              iVar20 = ptls_buffer__do_pushv(buf_00,&local_10b,2);
              pppVar24 = pppVar24 + 1;
            } while (iVar20 == 0);
          }
        }
      }
    }
  }
LAB_00108641:
  free(local_158);
  (*ptls_clear_memory)(binder_key,0x40);
  return iVar20;
LAB_00108e89:
  if (puVar36 == puVar31) goto LAB_00108ecf;
  if (((long)puVar31 - (long)puVar36 < 2) || (((long)puVar31 - (long)puVar36) - 2U < 2))
  goto LAB_001083d2;
  uVar37 = (ulong)(ushort)(puVar36[1] << 8 | puVar36[1] >> 8);
  if ((ulong)((long)puVar31 - (long)(puVar36 + 2)) < uVar37) goto LAB_001083d2;
  puVar36 = (ushort *)((long)(puVar36 + 2) + uVar37);
  goto LAB_00108e89;
LAB_00108ecf:
  if (((puVar31 == end) &&
      (uVar26 = (*ppVar5->get_time->cb)(ppVar5->get_time),
      not_before * 1000 < uVar26 || not_before * 1000 - uVar26 == 0)) &&
     (uVar26 <= not_after * 1000)) {
    (*ppVar5->random_bytes)((*esni)->nonce,0x10);
    iVar20 = ptls_calc_hash((((*esni)->client).cipher)->hash,((*esni)->client).record_digest,puVar35
                            ,uVar34);
    if (iVar20 == 0) {
      ppVar23 = *esni;
      psVar11 = (ppVar23->client).key_share;
      pVar15.len = resumption_ticket.len;
      pVar15.base = resumption_ticket.base;
      iVar20 = (*psVar11->exchange)(psVar11,&(ppVar23->client).pubkey,&ppVar23->secret,pVar15);
      if (iVar20 == 0) {
        ppVar23 = *esni;
        iVar20 = build_esni_contents_hash
                           (((ppVar23->client).cipher)->hash,ppVar23->esni_contents_hash,
                            (ppVar23->client).record_digest,((ppVar23->client).key_share)->id,
                            (ppVar23->client).pubkey,(uint8_t *)local_100);
        if (iVar20 == 0) goto LAB_001083e2;
      }
    }
    free_esni_secret(esni,0);
    goto LAB_00108641;
  }
LAB_001083d2:
  free(*esni);
  *esni = (ptls_esni_secret_t *)0x0;
LAB_001083e2:
  psVar7 = tls->ctx->update_esni_key;
  if (psVar7 != (st_ptls_update_esni_key_t *)0x0) {
    ppVar23 = tls->esni;
    iVar20 = (*psVar7->cb)(psVar7,tls,ppVar23->secret,((ppVar23->client).cipher)->hash,
                           ppVar23->esni_contents_hash);
    if (iVar20 != 0) goto LAB_00108641;
  }
LAB_0010841d:
  puVar35 = (ushort *)(properties->field_0).client.session_ticket.base;
  if (puVar35 == (ushort *)0x0) {
    local_148 = (ushort *)0x0;
    uVar34 = 0;
  }
  else {
    puVar38 = (uint8_t *)((properties->field_0).client.session_ticket.len + (long)puVar35);
    local_128 = puVar35;
    iVar19 = ptls_decode64(&not_before,(uint8_t **)&local_128,puVar38);
    if (((iVar19 == 0) && (1 < (long)puVar38 - (long)local_128)) &&
       ((1 < ((long)puVar38 - (long)local_128) + -2 &&
        (2 < (ulong)((long)puVar38 - (long)(local_128 + 2)))))) {
      uVar18 = *local_128;
      uVar3 = local_128[1];
      lVar33 = 0;
      uVar34 = 0;
      do {
        uVar34 = (ulong)*(byte *)((long)(local_128 + 2) + lVar33) | uVar34 << 8;
        lVar33 = lVar33 + 1;
      } while (lVar33 != 3);
      src = (uint8_t *)((long)local_128 + 7);
      if (uVar34 <= (ulong)((long)puVar38 - (long)src)) {
        puVar35 = (ushort *)(src + uVar34);
        iVar19 = decode_new_session_ticket
                           (tls,(uint32_t *)&not_after,&age_add,(ptls_iovec_t *)binder_key,
                            &resumption_ticket,&max_early_data_size,src,(uint8_t *)puVar35);
        if ((1 < (ulong)((long)puVar38 - (long)puVar35)) && (iVar19 == 0)) {
          uVar34 = (ulong)(ushort)(*puVar35 << 8 | *puVar35 >> 8);
          local_148 = puVar35 + 1;
          if ((uint8_t *)((long)puVar35 + uVar34 + 2) == puVar38 &&
              uVar34 <= (ulong)((long)puVar38 - (long)local_148)) {
            ppVar5 = tls->ctx;
            pppVar28 = ppVar5->key_exchanges;
            do {
              ppVar9 = *pppVar28;
              if (ppVar9 == (ptls_key_exchange_algorithm_t *)0x0) goto LAB_001084bf;
              pppVar28 = pppVar28 + 1;
            } while (ppVar9->id != (uint16_t)(uVar18 << 8 | uVar18 >> 8));
            pppVar24 = ppVar5->cipher_suites;
            do {
              ppVar6 = *pppVar24;
              if (ppVar6 == (ptls_cipher_suite_t *)0x0) goto LAB_001084bf;
              pppVar24 = pppVar24 + 1;
            } while (ppVar6->id != (uint16_t)(uVar3 << 8 | uVar3 >> 8));
            uVar26 = (*ppVar5->get_time->cb)(ppVar5->get_time);
            if ((not_before <= uVar26) && (uVar26 - not_before < 0x240c8400)) {
              bVar2 = (tls->field_18).server.pending_traffic_secret[0x38];
              iVar19 = (int)(uVar26 - not_before) + age_add;
              (tls->field_18).server.pending_traffic_secret[0x38] = bVar2 | 1;
              if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                tls->key_share = ppVar9;
              }
              tls->cipher_suite = ppVar6;
              if ((max_early_data_size != 0 && ppVar4 == (ptls_key_schedule_t *)0x0) &&
                 ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
                (tls->field_18).server.pending_traffic_secret[0x38] = bVar2 | 3;
                *(properties->field_0).client.max_early_data_size = (ulong)max_early_data_size;
              }
              goto LAB_001084dd;
            }
          }
        }
      }
    }
LAB_001084bf:
    iVar19 = 0;
    local_148 = (ushort *)0x0;
    uVar34 = 0;
  }
LAB_001084dd:
  pVar21 = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
  if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
    psVar8 = (properties->field_0).client.max_early_data_size;
    pVar21 = PTLS_EARLY_DATA_REJECTED;
    if (psVar8 != (size_t *)0x0) {
      *psVar8 = 0;
    }
  }
  (properties->field_0).client.early_data_acceptance = pVar21;
  iVar22 = iVar19;
  if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) &&
     (((properties->field_0).server.selected_psk_binder.base[0x2c] & 1) == 0)) {
LAB_00108518:
    tls->key_share = *tls->ctx->key_exchanges;
    iVar22 = iVar19;
  }
  goto LAB_0010852c;
LAB_001090cd:
  if (local_140 == (properties->field_0).client.negotiated_protocols.count) goto LAB_00109133;
  iVar20 = ptls_buffer__do_pushv(buf_00,"",1);
  if (iVar20 != 0) goto LAB_00108641;
  sVar27 = buf_00->off;
  ppVar12 = (properties->field_0).client.negotiated_protocols.list;
  iVar20 = ptls_buffer__do_pushv
                     (buf_00,*(void **)((long)ppVar12 + lVar29 + -8),
                      *(size_t *)((long)&ppVar12->base + lVar29));
  if (iVar20 != 0) goto LAB_00108641;
  buf_00->base[sVar27 - 1] = (char)(int)buf_00->off - (char)sVar27;
  local_140 = local_140 + 1;
  lVar29 = lVar29 + 0x10;
  goto LAB_001090cd;
LAB_00109133:
  lVar29 = buf_00->off - sVar10;
  buf_00->base[sVar10 - 2] = (uint8_t)((ulong)lVar29 >> 8);
  buf_00->base[sVar10 - 1] = (uint8_t)lVar29;
  lVar29 = buf_00->off - local_f0;
  buf_00->base[local_f0 - 2] = (uint8_t)((ulong)lVar29 >> 8);
  buf_00->base[local_f0 - 1] = (uint8_t)lVar29;
LAB_0010916e:
  if (tls->ctx->decompress_certificate != (ptls_decompress_certificate_t *)0x0) {
    local_a6 = 0x1b00;
    iVar20 = ptls_buffer__do_pushv(buf_00,&local_a6,2);
    if ((iVar20 != 0) || (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 != 0))
    goto LAB_00108641;
    sVar10 = buf_00->off;
    iVar20 = ptls_buffer__do_pushv(buf_00,"",1);
    if (iVar20 != 0) goto LAB_00108641;
    puVar35 = tls->ctx->decompress_certificate->supported_algorithms;
    uVar18 = *puVar35;
    if (uVar18 == 0xffff) {
      __assert_fail("*algo != UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x80e,
                    "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                   );
    }
    sVar27 = buf_00->off;
    while (puVar35 = puVar35 + 1, uVar18 != 0xffff) {
      local_10e = uVar18 << 8 | uVar18 >> 8;
      iVar20 = ptls_buffer__do_pushv(buf_00,&local_10e,2);
      if (iVar20 != 0) goto LAB_00108641;
      uVar18 = *puVar35;
    }
    buf_00->base[sVar27 - 1] = (char)(int)buf_00->off - (char)sVar27;
    lVar29 = buf_00->off - sVar10;
    buf_00->base[sVar10 - 2] = (uint8_t)((ulong)lVar29 >> 8);
    buf_00->base[sVar10 - 1] = (uint8_t)lVar29;
  }
  local_a8 = 0x2b00;
  iVar20 = ptls_buffer__do_pushv(buf_00,&local_a8,2);
  if ((iVar20 == 0) && (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 == 0)) {
    sVar10 = buf_00->off;
    iVar20 = ptls_buffer__do_pushv(buf_00,"",1);
    if (iVar20 == 0) {
      sVar27 = buf_00->off;
      lVar29 = 0;
      do {
        if (lVar29 == 8) {
          buf_00->base[sVar27 - 1] = (char)(int)buf_00->off - (char)sVar27;
          lVar29 = buf_00->off - sVar10;
          buf_00->base[sVar10 - 2] = (uint8_t)((ulong)lVar29 >> 8);
          buf_00->base[sVar10 - 1] = (uint8_t)lVar29;
          local_aa = 0xd00;
          iVar20 = ptls_buffer__do_pushv(buf_00,&local_aa,2);
          if ((iVar20 == 0) && (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 == 0)) {
            sVar10 = buf_00->off;
            iVar20 = push_signature_algorithms(tls->ctx->verify_certificate,buf_00);
            if (iVar20 == 0) {
              lVar29 = buf_00->off - sVar10;
              buf_00->base[sVar10 - 2] = (uint8_t)((ulong)lVar29 >> 8);
              buf_00->base[sVar10 - 1] = (uint8_t)lVar29;
              local_ac = 0xa00;
              iVar20 = ptls_buffer__do_pushv(buf_00,&local_ac,2);
              if ((iVar20 == 0) && (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 == 0)) {
                sVar10 = buf_00->off;
                pppVar28 = tls->ctx->key_exchanges;
                iVar20 = ptls_buffer__do_pushv(buf_00,"",2);
                if (iVar20 == 0) {
                  sVar27 = buf_00->off;
                  goto LAB_0010942b;
                }
              }
            }
          }
          break;
        }
        local_110 = *(ushort *)((long)supported_versions + lVar29) << 8 |
                    *(ushort *)((long)supported_versions + lVar29) >> 8;
        iVar20 = ptls_buffer__do_pushv(buf_00,&local_110,2);
        lVar29 = lVar29 + 2;
      } while (iVar20 == 0);
    }
  }
  goto LAB_00108641;
  while( true ) {
    uVar18 = (*pppVar28)->id;
    local_112 = uVar18 << 8 | uVar18 >> 8;
    iVar20 = ptls_buffer__do_pushv(buf_00,&local_112,2);
    pppVar28 = pppVar28 + 1;
    if (iVar20 != 0) break;
LAB_0010942b:
    if (*pppVar28 == (ptls_key_exchange_algorithm_t *)0x0) {
      lVar29 = buf_00->off - sVar27;
      buf_00->base[sVar27 - 2] = (uint8_t)((ulong)lVar29 >> 8);
      buf_00->base[sVar27 - 1] = (uint8_t)lVar29;
      lVar29 = buf_00->off - sVar10;
      buf_00->base[sVar10 - 2] = (uint8_t)((ulong)lVar29 >> 8);
      buf_00->base[sVar10 - 1] = (uint8_t)lVar29;
      if ((local_e0 != (ptls_iovec_t *)0x0) && (local_e0->base != (uint8_t *)0x0)) {
        local_ae = 0x2c00;
        iVar20 = ptls_buffer__do_pushv(buf_00,&local_ae,2);
        if ((iVar20 != 0) || (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 != 0)) break;
        sVar10 = buf_00->off;
        iVar20 = ptls_buffer__do_pushv(buf_00,"",2);
        if (iVar20 != 0) break;
        sVar27 = buf_00->off;
        iVar20 = ptls_buffer__do_pushv(buf_00,local_e0->base,local_e0->len);
        if (iVar20 != 0) break;
        lVar29 = buf_00->off - sVar27;
        buf_00->base[sVar27 - 2] = (uint8_t)((ulong)lVar29 >> 8);
        buf_00->base[sVar27 - 1] = (uint8_t)lVar29;
        lVar29 = buf_00->off - sVar10;
        buf_00->base[sVar10 - 2] = (uint8_t)((ulong)lVar29 >> 8);
        buf_00->base[sVar10 - 1] = (uint8_t)lVar29;
      }
      if ((tls->ctx->field_0x70 & 0x20) != 0) {
        local_b0 = 0x1400;
        iVar20 = ptls_buffer__do_pushv(buf_00,&local_b0,2);
        if ((iVar20 != 0) || (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 != 0)) break;
        sVar10 = buf_00->off;
        iVar20 = ptls_buffer__do_pushv(buf_00,"",1);
        if (iVar20 != 0) break;
        sVar27 = buf_00->off;
        local_113 = 2;
        iVar20 = ptls_buffer__do_pushv(buf_00,&local_113,1);
        if (iVar20 != 0) break;
        buf_00->base[sVar27 - 1] = (char)(int)buf_00->off - (char)sVar27;
        lVar29 = buf_00->off - sVar10;
        buf_00->base[sVar10 - 2] = (uint8_t)((ulong)lVar29 >> 8);
        buf_00->base[sVar10 - 1] = (uint8_t)lVar29;
      }
      iVar20 = push_additional_extensions(properties,buf_00);
      if (iVar20 != 0) break;
      if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0 && local_148 == (ushort *)0x0)
      goto LAB_0010986a;
      local_b2 = 0x2d00;
      iVar20 = ptls_buffer__do_pushv(buf_00,&local_b2,2);
      if ((iVar20 != 0) || (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 != 0)) break;
      sVar10 = buf_00->off;
      iVar20 = ptls_buffer__do_pushv(buf_00,"",1);
      if (iVar20 != 0) break;
      sVar27 = buf_00->off;
      if ((tls->ctx->field_0x70 & 1) == 0) {
        local_114 = 0;
        iVar20 = ptls_buffer__do_pushv(buf_00,&local_114,1);
        if (iVar20 != 0) break;
      }
      local_115 = 1;
      iVar20 = ptls_buffer__do_pushv(buf_00,&local_115,1);
      if (iVar20 == 0) {
        buf_00->base[sVar27 - 1] = (char)(int)buf_00->off - (char)sVar27;
        lVar29 = buf_00->off - sVar10;
        buf_00->base[sVar10 - 2] = (uint8_t)((ulong)lVar29 >> 8);
        buf_00->base[sVar10 - 1] = (uint8_t)lVar29;
        if (local_148 == (ushort *)0x0) goto LAB_0010986a;
        if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0 ||
            ppVar4 != (ptls_key_schedule_t *)0x0) goto LAB_001096ae;
        local_b4 = 0x2a00;
        iVar20 = ptls_buffer__do_pushv(buf_00,&local_b4,2);
        if ((iVar20 == 0) && (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 == 0)) {
          sVar10 = buf_00->off;
          for (lVar29 = -2; lVar29 != 0; lVar29 = lVar29 + 1) {
            buf_00->base[lVar29 + sVar10] = '\0';
          }
LAB_001096ae:
          local_b6 = 0x2900;
          iVar20 = ptls_buffer__do_pushv(buf_00,&local_b6,2);
          if ((iVar20 == 0) && (iVar20 = ptls_buffer__do_pushv(buf_00,"",2), iVar20 == 0)) {
            sVar10 = buf_00->off;
            iVar20 = ptls_buffer__do_pushv(buf_00,"",2);
            if (iVar20 == 0) {
              sVar27 = buf_00->off;
              iVar20 = ptls_buffer__do_pushv(buf_00,"",2);
              if (iVar20 != 0) break;
              sVar13 = buf_00->off;
              iVar20 = ptls_buffer__do_pushv(buf_00,resumption_ticket.base,resumption_ticket.len);
              if (iVar20 == 0) {
                lVar29 = buf_00->off - sVar13;
                buf_00->base[sVar13 - 2] = (uint8_t)((ulong)lVar29 >> 8);
                buf_00->base[sVar13 - 1] = (uint8_t)lVar29;
                local_ba = (undefined1)((uint)iVar22 >> 0x18);
                local_b9 = (undefined1)((uint)iVar22 >> 0x10);
                local_b8 = (undefined1)((uint)iVar22 >> 8);
                local_b7 = (undefined1)iVar22;
                iVar20 = ptls_buffer__do_pushv(buf_00,&local_ba,4);
                if (iVar20 == 0) {
                  lVar29 = buf_00->off - sVar27;
                  buf_00->base[sVar27 - 2] = (uint8_t)((ulong)lVar29 >> 8);
                  buf_00->base[sVar27 - 1] = (uint8_t)lVar29;
                  iVar20 = ptls_buffer__do_pushv(buf_00,"",2);
                  if (iVar20 == 0) {
                    sVar27 = buf_00->off;
                    iVar20 = ptls_buffer__do_pushv(buf_00,"",1);
                    if (iVar20 == 0) {
                      sVar13 = buf_00->off;
                      iVar20 = ptls_buffer_reserve(buf_00,(tls->key_schedule->hashes[0].algo)->
                                                          digest_size);
                      if (iVar20 == 0) {
                        sVar32 = buf_00->off + (tls->key_schedule->hashes[0].algo)->digest_size;
                        buf_00->off = sVar32;
                        buf_00->base[sVar13 - 1] = (char)sVar32 - (char)sVar13;
                        lVar29 = buf_00->off - sVar27;
                        buf_00->base[sVar27 - 2] = (uint8_t)((ulong)lVar29 >> 8);
                        buf_00->base[sVar27 - 1] = (uint8_t)lVar29;
                        lVar29 = buf_00->off - sVar10;
                        buf_00->base[sVar10 - 2] = (uint8_t)((ulong)lVar29 >> 8);
                        buf_00->base[sVar10 - 1] = (uint8_t)lVar29;
LAB_0010986a:
                        lVar29 = buf_00->off - (long)local_108;
                        (buf_00->base + -2)[(long)local_108] = (uint8_t)((ulong)lVar29 >> 8);
                        (buf_00->base + -1)[(long)local_108] = (uint8_t)lVar29;
                        uVar34 = local_e8->off - (long)local_f8;
                        for (; local_100 != (ptls_key_exchange_algorithm_t **)0xfffffffffffffff8;
                            local_100 = local_100 + -1) {
                          local_f8->record_digest[(long)(local_e8->base + -0x23)] =
                               (uint8_t)(uVar34 >> ((byte)local_100 & 0x3f));
                          local_f8 = (anon_struct_104_5_dae46d3e_for_client *)
                                     ((long)&local_f8->key_share + 1);
                        }
                        iVar20 = (*local_120->commit_message)(local_120);
                        if (iVar20 == 0) {
                          local_150 = lVar33;
                          if (local_148 != (ushort *)0x0) {
                            sVar10 = local_120->buf->off;
                            ppVar14 = tls->key_schedule->hashes[0].algo;
                            sVar27 = ppVar14->digest_size;
                            iVar20 = derive_secret_with_hash
                                               (tls->key_schedule,binder_key,"res binder",
                                                ppVar14->empty_digest);
                            ppVar16 = local_120;
                            if (iVar20 != 0) break;
                            lVar29 = sVar10 - sVar27;
                            local_150 = lVar29 + -3;
                            ptls__key_schedule_update_hash
                                      (tls->key_schedule,local_120->buf->base + lVar33,
                                       local_150 - lVar33);
                            iVar20 = calc_verify_data(ppVar16->buf->base + lVar29,tls->key_schedule,
                                                      binder_key);
                            if (iVar20 != 0) break;
                          }
                          ptls__key_schedule_update_hash
                                    (tls->key_schedule,local_120->buf->base + local_150,
                                     local_120->buf->off - local_150);
                          if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) != 0) {
                            if (ppVar4 != (ptls_key_schedule_t *)0x0) {
                              __assert_fail("!is_second_flight",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                            ,0x85f,
                                            "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                                           );
                            }
                            iVar20 = setup_traffic_protection(tls,1,"c e traffic",1,0);
                            if ((iVar20 != 0) ||
                               (iVar20 = push_change_cipher_spec(tls,local_120), iVar20 != 0))
                            break;
                          }
                          if ((ppVar4 != (ptls_key_schedule_t *)0x0 || local_148 == (ushort *)0x0)
                             || (iVar20 = derive_exporter_secret(tls,1), iVar20 == 0)) {
                            tls->state = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO -
                                         (local_e0 == (ptls_iovec_t *)0x0);
                            iVar20 = 0x202;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_00108641;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    ptls_iovec_t resumption_secret = {NULL}, resumption_ticket;
    char *published_sni = NULL;
    uint32_t obfuscated_ticket_age = 0;
    size_t msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret, is_second_flight = tls->key_schedule != NULL,
             send_sni = tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name);

    if (properties != NULL) {
        /* try to use ESNI */
        if (!is_second_flight && send_sni && properties->client.esni_keys.base != NULL) {
            if ((ret = client_setup_esni(tls->ctx, &tls->esni, properties->client.esni_keys, &published_sni, tls->client_random)) !=
                0) {
                goto Exit;
            }
            if (tls->ctx->update_esni_key != NULL) {
                if ((ret = tls->ctx->update_esni_key->cb(tls->ctx->update_esni_key, tls, tls->esni->secret,
                                                         tls->esni->client.cipher->hash, tls->esni->esni_contents_hash)) != 0)
                    goto Exit;
            }
        }
        /* setup resumption-related data. If successful, resumption_secret becomes a non-zero value. */
        if (properties->client.session_ticket.base != NULL) {
            ptls_key_exchange_algorithm_t *key_share = NULL;
            ptls_cipher_suite_t *cipher_suite = NULL;
            uint32_t max_early_data_size;
            if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &resumption_secret, &obfuscated_ticket_age,
                                             &resumption_ticket, &max_early_data_size, properties->client.session_ticket.base,
                                             properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
                tls->client.offered_psk = 1;
                /* key-share selected by HRR should not be overridden */
                if (tls->key_share == NULL)
                    tls->key_share = key_share;
                tls->cipher_suite = cipher_suite;
                if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                    tls->client.using_early_data = 1;
                    *properties->client.max_early_data_size = max_early_data_size;
                }
            } else {
                resumption_secret = ptls_iovec_init(NULL, 0);
            }
        }
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    if (!is_second_flight) {
        tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ctx->hkdf_label_prefix__obsolete);
        if ((ret = key_schedule_extract(tls->key_schedule, resumption_secret)) != 0)
            goto Exit;
    }

    msghash_off = emitter->buf->off + emitter->record_header_length;
    ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        ptls_buffer_t *sendbuf = emitter->buf;
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, tls->client_random, sizeof(tls->client_random));
        /* lecagy_session_id */
        ptls_buffer_push_block(
            sendbuf, 1, { ptls_buffer_pushv(sendbuf, tls->client.legacy_session_id.base, tls->client.legacy_session_id.len); });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = tls->ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            struct {
                size_t off;
                size_t len;
            } key_share_client_hello;
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                key_share_client_hello.off = sendbuf->off;
                ptls_buffer_push_block(sendbuf, 2, {
                    if (tls->key_share != NULL) {
                        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
                            goto Exit;
                        if ((ret = push_key_share_entry(sendbuf, tls->key_share->id, tls->client.key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    }
                });
                key_share_client_hello.len = sendbuf->off - key_share_client_hello.off;
            });
            if (send_sni) {
                if (tls->esni != NULL) {
                    if (published_sni != NULL) {
                        buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                            if ((ret = emit_server_name_extension(sendbuf, published_sni)) != 0)
                                goto Exit;
                        });
                    }
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME, {
                        if ((ret = emit_esni_extension(tls->esni, sendbuf, properties->client.esni_keys, tls->server_name,
                                                       key_share_client_hello.off, key_share_client_hello.len)) != 0)
                            goto Exit;
                    });
                } else {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                        if ((ret = emit_server_name_extension(sendbuf, tls->server_name)) != 0)
                            goto Exit;
                    });
                }
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (tls->ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = tls->ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(tls->ctx->verify_certificate, sendbuf)) != 0)
                    goto Exit;
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                ptls_key_exchange_algorithm_t **algo = tls->ctx->key_exchanges;
                ptls_buffer_push_block(sendbuf, 2, {
                    for (; *algo != NULL; ++algo)
                        ptls_buffer_push16(sendbuf, (*algo)->id);
                });
            });
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if (tls->ctx->use_raw_public_keys) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE, {
                    ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, PTLS_CERTIFICATE_TYPE_RAW_PUBLIC_KEY); });
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (tls->ctx->save_ticket != NULL || resumption_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!tls->ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (resumption_secret.base != NULL) {
                if (tls->client.using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2,
                                               { ptls_buffer_pushv(sendbuf, resumption_ticket.base, resumption_ticket.len); });
                        ptls_buffer_push32(sendbuf, obfuscated_ticket_age);
                    });
                    /* allocate space for PSK binder. the space is filled at the bottom of the function */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                                goto Exit;
                            sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
                        });
                    });
                });
            }
        });
    });

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (resumption_secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, "res binder")) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off);

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
            goto Exit;
    }
    if (resumption_secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    if (published_sni != NULL) {
        free(published_sni);
    }
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}